

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall
cppforth::Forth::ForthStack<unsigned_int>::setTop(ForthStack<unsigned_int> *this,uint Value)

{
  uint uVar1;
  size_type sVar2;
  AbortException *this_00;
  reference pvVar3;
  Cell index1;
  uint Value_local;
  ForthStack<unsigned_int> *this_local;
  
  uVar1 = this->top;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->stack);
  if (sVar2 <= uVar1) {
    this_00 = (AbortException *)__cxa_allocate_exception(0x10);
    AbortException::AbortException(this_00,"Forth stack overflow");
    __cxa_throw(this_00,&AbortException::typeinfo,AbortException::~AbortException);
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&this->stack,(ulong)this->top);
  *pvVar3 = Value;
  return;
}

Assistant:

void setTop(CellType Value){
				{auto index1 = top ;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(top) = Value;
			}